

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void scaleLp(HighsOptions *options,HighsLp *lp,bool force_scaling)

{
  double dVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  byte in_DL;
  int *in_RSI;
  long in_RDI;
  HighsInt iRow;
  HighsInt iCol;
  bool equilibration_scaling;
  HighsScale *scale;
  bool scaled_matrix;
  bool no_scaling;
  double original_matrix_max_value;
  double original_matrix_min_value;
  double no_scaling_original_matrix_max_value;
  double no_scaling_original_matrix_min_value;
  HighsInt use_scale_strategy;
  HighsInt simplex_scale_strategy;
  vector<double,_std::allocator<double>_> *rowUpper;
  vector<double,_std::allocator<double>_> *rowLower;
  vector<double,_std::allocator<double>_> *colUpper;
  vector<double,_std::allocator<double>_> *colLower;
  vector<double,_std::allocator<double>_> *colCost;
  HighsInt numRow;
  HighsInt numCol;
  HighsInt in_stack_0000019c;
  HighsLp *in_stack_000001a0;
  HighsOptions *in_stack_000001a8;
  HighsInt in_stack_000004fc;
  HighsLp *in_stack_00000500;
  HighsOptions *in_stack_00000508;
  size_type in_stack_ffffffffffffff38;
  value_type vVar5;
  HighsLp *in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff61;
  undefined1 in_stack_ffffffffffffff62;
  undefined1 in_stack_ffffffffffffff63;
  undefined4 in_stack_ffffffffffffff64;
  int iVar6;
  int local_98;
  bool local_72;
  int local_50;
  
  HighsLp::clearScaling(in_stack_ffffffffffffff40);
  iVar2 = *in_RSI;
  iVar3 = in_RSI[1];
  local_50 = *(int *)(in_RDI + 0x168);
  if (local_50 == 1) {
    local_50 = 3;
  }
  HighsSparseMatrix::range
            ((HighsSparseMatrix *)
             CONCAT44(in_stack_ffffffffffffff64,
                      CONCAT13(in_stack_ffffffffffffff63,
                               CONCAT12(in_stack_ffffffffffffff62,
                                        CONCAT11(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60
                                                )))),in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50);
  if ((in_DL & 1) == 0) {
    if (*(int *)(in_RDI + 0x160) != 0) {
      highsLogDev((HighsLogOptions *)0x7ff0000000000000,0,(char *)0x3fc999999999999a,
                  0x4014000000000000,in_RDI + 0x380,1,
                  "Scaling: Matrix has [min, max] values of [%g, %g] within [%g, %g] so no scaling performed\n"
                 );
    }
  }
  else {
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(value_type_conflict1 *)0x4f970f);
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(value_type_conflict1 *)0x4f9738);
    if (local_50 == 2 || local_50 == 3) {
      local_72 = equilibrationScaleMatrix(in_stack_00000508,in_stack_00000500,in_stack_000004fc);
    }
    else {
      local_72 = maxValueScaleMatrix(in_stack_000001a8,in_stack_000001a0,in_stack_0000019c);
    }
    if (local_72 == false) {
      HighsLp::clearScaling(in_stack_ffffffffffffff40);
    }
    else {
      for (local_98 = 0; local_98 < iVar2; local_98 = local_98 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x88),
                            (long)local_98);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)local_98);
        *pvVar4 = *pvVar4 / dVar1;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x88),
                            (long)local_98);
        vVar5 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)local_98
                           );
        *pvVar4 = *pvVar4 / vVar5;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x88),
                            (long)local_98);
        vVar5 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 2),(long)local_98);
        *pvVar4 = vVar5 * *pvVar4;
      }
      for (iVar6 = 0; iVar6 < iVar3; iVar6 = iVar6 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x8e),(long)iVar6);
        vVar5 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x14),(long)iVar6);
        *pvVar4 = vVar5 * *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x8e),(long)iVar6);
        vVar5 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x1a),(long)iVar6);
        *pvVar4 = vVar5 * *pvVar4;
      }
      *(undefined1 *)(in_RSI + 0x83) = 1;
      in_RSI[0x84] = iVar2;
      in_RSI[0x85] = iVar3;
      in_RSI[0x86] = 0;
      in_RSI[0x87] = 0x3ff00000;
      *(undefined1 *)(in_RSI + 0x94) = 1;
    }
  }
  in_RSI[0x82] = local_50;
  return;
}

Assistant:

void scaleLp(const HighsOptions& options, HighsLp& lp,
             const bool force_scaling) {
  lp.clearScaling();
  HighsInt numCol = lp.num_col_;
  HighsInt numRow = lp.num_row_;
  // Scaling not well defined for models with no columns
  assert(numCol > 0);
  vector<double>& colCost = lp.col_cost_;
  vector<double>& colLower = lp.col_lower_;
  vector<double>& colUpper = lp.col_upper_;
  vector<double>& rowLower = lp.row_lower_;
  vector<double>& rowUpper = lp.row_upper_;

  // Save the simplex_scale_strategy so that the option can be
  // modified for the course of this method
  HighsInt simplex_scale_strategy = options.simplex_scale_strategy;
  // Determine the actual strategy to use
  HighsInt use_scale_strategy = simplex_scale_strategy;
  if (use_scale_strategy == kSimplexScaleStrategyChoose) {
    // HiGHS is left to choose: currently use forced equilibration, but maybe do
    // something more intelligent
    use_scale_strategy = kSimplexScaleStrategyForcedEquilibration;
  }
  // Find out range of matrix values and skip matrix scaling if all
  // |values| are in [0.2, 5]
  const double no_scaling_original_matrix_min_value = 0.2;
  const double no_scaling_original_matrix_max_value = 5.0;
  double original_matrix_min_value = kHighsInf;
  double original_matrix_max_value = 0;
  lp.a_matrix_.range(original_matrix_min_value, original_matrix_max_value);
  // Possibly force scaling, otherwise base the decision on the range
  // of values in the matrix, values that will be used later for
  // reporting
  const bool no_scaling = force_scaling
                              ? false
                              : (original_matrix_min_value >=
                                 no_scaling_original_matrix_min_value) &&
                                    (original_matrix_max_value <=
                                     no_scaling_original_matrix_max_value);
  bool scaled_matrix = false;
  if (no_scaling) {
    // No matrix scaling, but possible cost scaling
    if (options.highs_analysis_level)
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Matrix has [min, max] values of [%g, %g] within "
                  "[%g, %g] so no scaling performed\n",
                  original_matrix_min_value, original_matrix_max_value,
                  no_scaling_original_matrix_min_value,
                  no_scaling_original_matrix_max_value);
  } else {
    // Try scaling, so assign unit factors - partly because initial
    // factors may be assumed by the scaling method, but also because
    // scaling factors may not be computed for empty rows/columns
    HighsScale& scale = lp.scale_;
    scale.col.assign(numCol, 1);
    scale.row.assign(numRow, 1);
    const bool equilibration_scaling =
        use_scale_strategy == kSimplexScaleStrategyEquilibration ||
        use_scale_strategy == kSimplexScaleStrategyForcedEquilibration;
    // Try scaling. Value of scaled_matrix indicates whether scaling
    // was considered valuable (and performed). If it's not valuable
    // then the matrix remains unscaled
    if (equilibration_scaling) {
      scaled_matrix = equilibrationScaleMatrix(options, lp, use_scale_strategy);
    } else {
      scaled_matrix = maxValueScaleMatrix(options, lp, use_scale_strategy);
    }
    if (scaled_matrix) {
      // Matrix is scaled, so scale the bounds and costs
      for (HighsInt iCol = 0; iCol < numCol; iCol++) {
        colLower[iCol] /= scale.col[iCol];
        colUpper[iCol] /= scale.col[iCol];
        colCost[iCol] *= scale.col[iCol];
      }
      for (HighsInt iRow = 0; iRow < numRow; iRow++) {
        rowLower[iRow] *= scale.row[iRow];
        rowUpper[iRow] *= scale.row[iRow];
      }
      scale.has_scaling = true;
      scale.num_col = numCol;
      scale.num_row = numRow;
      scale.cost = 1.0;
      lp.is_scaled_ = true;
    } else {
      // Matrix is not scaled, so clear the scaling
      lp.clearScaling();
    }
  }
  // Record the scaling strategy used
  lp.scale_.strategy = use_scale_strategy;
  // Possibly scale the costs
  //  if (allow_cost_scaling) scaleSimplexCost(options, lp, scale.cost);

  // If matrix is unscaled, then LP is only scaled if there is a cost scaling
  // factor
  //  if (!scaled_matrix) lp.is_scaled_ = scale.cost != 1;
}